

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall SBarInfoCommandFlowControl::Reset(SBarInfoCommandFlowControl *this)

{
  uint uVar1;
  SBarInfoCommand **ppSVar2;
  long lVar3;
  uint i;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    ppSVar2 = this->commands[lVar4].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
    uVar1 = this->commands[lVar4].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
    for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
      (**(code **)(**(long **)((long)ppSVar2 + lVar3) + 0x20))();
    }
  }
  return;
}

Assistant:

void	Reset()
		{
			for(unsigned int i = 0;i < 2;i++)
			{
				for(auto command : commands[i])
					command->Reset();
			}
		}